

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

DeviceState __thiscall molly::Device::sample(Device *this)

{
  ssize_t sVar1;
  ostream *poVar2;
  MollyError *pMVar3;
  int *piVar4;
  char *pcVar5;
  DeviceState DVar6;
  uchar code;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream msg;
  ostream local_190 [376];
  
  if (this->_fd == -1) {
    pMVar3 = (MollyError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_1c0,"Device not yet open",(allocator *)&msg);
    MollyError::MollyError(pMVar3,&local_1c0);
    __cxa_throw(pMVar3,&MollyError::typeinfo,MollyError::~MollyError);
  }
  sVar1 = write(this->_fd,&DAT_00103147,8);
  if (-1 < sVar1) {
    sVar1 = read(this->_fd,&code,1);
    if (sVar1 == 1) {
      DVar6 = (DeviceState)code;
      if (2 < (byte)(code - 0x15)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
        poVar2 = std::operator<<(local_190,"Unexpected response: ");
        std::ostream::operator<<((ostream *)poVar2,(uint)code);
        pMVar3 = (MollyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        MollyError::MollyError(pMVar3,&local_220);
        __cxa_throw(pMVar3,&MollyError::typeinfo,MollyError::~MollyError);
      }
    }
    else {
      piVar4 = __errno_location();
      if (*piVar4 != 0xb) {
        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
        poVar2 = std::operator<<(local_190,"Error reading from device: ");
        pcVar5 = strerror(*piVar4);
        std::operator<<(poVar2,pcVar5);
        pMVar3 = (MollyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        MollyError::MollyError(pMVar3,&local_200);
        __cxa_throw(pMVar3,&MollyError::typeinfo,MollyError::~MollyError);
      }
      DVar6 = Unavailable;
    }
    return DVar6;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar2 = std::operator<<(local_190,"Error writing to device: ");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  std::operator<<(poVar2,pcVar5);
  pMVar3 = (MollyError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  MollyError::MollyError(pMVar3,&local_1e0);
  __cxa_throw(pMVar3,&MollyError::typeinfo,MollyError::~MollyError);
}

Assistant:

DeviceState Device::sample()
{
  if (_fd == INVALID_FD)
    throw MollyError("Device not yet open");

  char buf[8] = {0x08, 0, 0, 0, 0, 0, 0, 0x02 };

  ssize_t res = ::write(_fd, buf, 8);

  if (res < 0)
  {
    stringstream msg;
    msg << "Error writing to device: " << strerror(errno);
    throw MollyError(msg.str());
  }

  unsigned char code;
  res = read(_fd, &code, 1);

  if (res != 1)
  {
    if (errno == EAGAIN)
      return DeviceState::Unavailable;

    stringstream msg;
    msg << "Error reading from device: " << strerror(errno);
    throw MollyError(msg.str());
  }

  switch (code)
  {
    case (unsigned char)DeviceState::ButtonPressed:
      return DeviceState::ButtonPressed;
    case (unsigned char)DeviceState::LidClosed:
      return DeviceState::LidClosed;
    case (unsigned char)DeviceState::LidOpen:
      return DeviceState::LidOpen;
    default:
      stringstream msg;
      msg << "Unexpected response: " << (int)code;
      throw MollyError(msg.str());
  }
}